

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_inquisitor.cpp
# Opt level: O1

int AF_A_InquisitorAttack(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  double dVar1;
  VM_UBYTE VVar2;
  AActor *self;
  undefined8 *puVar3;
  PClass *pPVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined8 uVar6;
  PClass *pPVar7;
  PClassActor *pPVar8;
  AActor *pAVar9;
  uint uVar10;
  VMValue *pVVar11;
  char *__assertion;
  bool bVar12;
  double z;
  
  pPVar4 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_005ccf38;
  }
  if (((param->field_0).field_3.Type == '\x03') &&
     (((param->field_0).field_1.atag == 1 || ((param->field_0).field_1.a == (void *)0x0)))) {
    self = (AActor *)(param->field_0).field_1.a;
    pVVar11 = param;
    uVar10 = numparam;
    if (self != (AActor *)0x0) {
      if ((self->super_DThinker).super_DObject.Class == (PClass *)0x0) {
        iVar5 = (**(self->super_DThinker).super_DObject._vptr_DObject)(self);
        (self->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar5);
      }
      pPVar7 = (self->super_DThinker).super_DObject.Class;
      bVar12 = pPVar7 == (PClass *)0x0;
      ret = (VMReturn *)(ulong)!bVar12;
      uVar10 = (uint)bVar12;
      pVVar11 = (VMValue *)(ulong)(pPVar7 == pPVar4 || bVar12);
      if (pPVar7 != pPVar4 && !bVar12) {
        do {
          pPVar7 = pPVar7->ParentClass;
          ret = (VMReturn *)(ulong)(pPVar7 != (PClass *)0x0);
          if (pPVar7 == pPVar4) break;
        } while (pPVar7 != (PClass *)0x0);
      }
      if ((char)ret == '\0') {
        __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
        goto LAB_005ccf38;
      }
    }
    pPVar4 = AActor::RegistrationInfo.MyClass;
    if ((numparam != 1) && (VVar2 = param[1].field_0.field_3.Type, VVar2 != 0xff)) {
      if ((VVar2 != '\x03') ||
         ((param[1].field_0.field_1.atag != 1 && (param[1].field_0.field_1.a != (void *)0x0))))
      goto LAB_005ccf0d;
      puVar3 = (undefined8 *)param[1].field_0.field_1.a;
      if (puVar3 != (undefined8 *)0x0) {
        if (puVar3[1] == 0) {
          uVar6 = (**(code **)*puVar3)(puVar3,pVVar11,uVar10,ret);
          puVar3[1] = uVar6;
        }
        pPVar7 = (PClass *)puVar3[1];
        bVar12 = pPVar7 != (PClass *)0x0;
        if (pPVar7 != pPVar4 && bVar12) {
          do {
            pPVar7 = pPVar7->ParentClass;
            bVar12 = pPVar7 != (PClass *)0x0;
            if (pPVar7 == pPVar4) break;
          } while (pPVar7 != (PClass *)0x0);
        }
        if (!bVar12) {
          __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_005ccf38;
        }
      }
    }
    if (((numparam < 3) || (VVar2 = param[2].field_0.field_3.Type, VVar2 == 0xff)) ||
       ((VVar2 == '\x03' &&
        ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
      pAVar9 = (self->target).field_0.p;
      if (pAVar9 != (AActor *)0x0) {
        if (((pAVar9->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
          A_FaceTarget(self);
          dVar1 = (self->Angles).Yaw.Degrees;
          z = (self->__Pos).Z + 32.0;
          (self->__Pos).Z = z;
          (self->Angles).Yaw.Degrees = dVar1 + -1.40625;
          pAVar9 = (self->target).field_0.p;
          if ((pAVar9 != (AActor *)0x0) &&
             (((pAVar9->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
            (self->target).field_0.p = (AActor *)0x0;
            pAVar9 = (AActor *)0x0;
          }
          pPVar8 = PClass::FindActor("InquisitorShot");
          pAVar9 = P_SpawnMissileZAimed(self,z,pAVar9,pPVar8);
          if (pAVar9 != (AActor *)0x0) {
            (pAVar9->Vel).Z = (pAVar9->Vel).Z + 9.0;
          }
          dVar1 = (self->__Pos).Z;
          (self->Angles).Yaw.Degrees = (self->Angles).Yaw.Degrees + 2.8125;
          pAVar9 = (self->target).field_0.p;
          if ((pAVar9 != (AActor *)0x0) &&
             (((pAVar9->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
            (self->target).field_0.p = (AActor *)0x0;
            pAVar9 = (AActor *)0x0;
          }
          pPVar8 = PClass::FindActor("InquisitorShot");
          pAVar9 = P_SpawnMissileZAimed(self,dVar1,pAVar9,pPVar8);
          if (pAVar9 != (AActor *)0x0) {
            (pAVar9->Vel).Z = (pAVar9->Vel).Z + 16.0;
          }
          (self->__Pos).Z = (self->__Pos).Z + -32.0;
        }
        else {
          (self->target).field_0.p = (AActor *)0x0;
        }
      }
      return 0;
    }
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
    ;
  }
  else {
LAB_005ccf0d:
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_005ccf38:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_strife/a_inquisitor.cpp"
                ,0x37,"int AF_A_InquisitorAttack(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_InquisitorAttack)
{
	PARAM_ACTION_PROLOGUE;

	AActor *proj;

	if (self->target == NULL)
		return 0;

	A_FaceTarget (self);

	self->AddZ(32);
	self->Angles.Yaw -= 45./32;
	proj = P_SpawnMissileZAimed (self, self->Z(), self->target, PClass::FindActor("InquisitorShot"));
	if (proj != NULL)
	{
		proj->Vel.Z += 9;
	}
	self->Angles.Yaw += 45./16;
	proj = P_SpawnMissileZAimed (self, self->Z(), self->target, PClass::FindActor("InquisitorShot"));
	if (proj != NULL)
	{
		proj->Vel.Z += 16;
	}
	self->AddZ(-32);
	return 0;
}